

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuMatrix.hpp
# Opt level: O3

void deqp::gles2::Functional::MatrixCaseUtils::Evaluator<2,_2,_5,_0,_2>::evaluate
               (ShaderEvalContext *evalCtx)

{
  bool bVar1;
  bool bVar2;
  float *pfVar3;
  float *pfVar4;
  bool bVar5;
  long lVar6;
  float v;
  float fVar7;
  float fVar8;
  float local_3c [5];
  Mat2 m;
  int aiStack_18 [6];
  
  m.m_data.m_data[0].m_data[0] = evalCtx->in[0].m_data[0];
  m.m_data.m_data[0].m_data[1] = evalCtx->in[0].m_data[1];
  m.m_data.m_data[1].m_data[0] = evalCtx->in[1].m_data[0];
  m.m_data.m_data[1].m_data[1] = evalCtx->in[1].m_data[1];
  local_3c[1] = 0.0;
  local_3c[0] = 0.0;
  pfVar3 = local_3c + 1;
  pfVar4 = (float *)&m;
  bVar1 = true;
  do {
    bVar2 = bVar1;
    fVar7 = 0.0;
    lVar6 = 0;
    fVar8 = DAT_0224ba08;
    bVar1 = true;
    do {
      bVar5 = bVar1;
      fVar7 = fVar7 + fVar8 * pfVar4[lVar6 * 2];
      lVar6 = 1;
      fVar8 = DAT_0224ba0c;
      bVar1 = false;
    } while (bVar5);
    *pfVar3 = fVar7;
    pfVar3 = local_3c;
    pfVar4 = m.m_data.m_data[0].m_data + 1;
    bVar1 = false;
  } while (bVar2);
  local_3c[2] = local_3c[1];
  local_3c[3] = local_3c[0];
  local_3c[4] = local_3c[1];
  aiStack_18[2] = 0;
  aiStack_18[3] = 1;
  aiStack_18[4] = 2;
  lVar6 = 2;
  do {
    (evalCtx->color).m_data[aiStack_18[lVar6]] = local_3c[lVar6];
    lVar6 = lVar6 + 1;
  } while (lVar6 != 5);
  return;
}

Assistant:

Matrix<T, Rows, Cols>::Matrix (void)
{
	for (int row = 0; row < Rows; row++)
		for (int col = 0; col < Cols; col++)
			(*this)(row, col) = (row == col) ? T(1) : T(0);
}